

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_language(void)

{
  byte bVar1;
  int iVar2;
  Status SVar3;
  XMLCh *pXVar4;
  char *pcVar5;
  XSValue *pXVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_4b0;
  StrX local_4a0;
  StrX local_490;
  long local_480;
  XMLCh *actRetCanRep_5;
  undefined1 local_470 [4];
  Status myStatus_17;
  StrX local_460;
  StrX local_450;
  long local_440;
  XMLCh *actRetCanRep_4;
  undefined1 local_430 [4];
  Status myStatus_16;
  StrX local_420;
  StrX local_410;
  long local_400;
  XMLCh *actRetCanRep_3;
  undefined1 local_3f0 [4];
  Status myStatus_15;
  StrX local_3e0;
  StrX local_3d0;
  long local_3c0;
  XMLCh *actRetCanRep_2;
  undefined1 local_3b0 [4];
  Status myStatus_14;
  StrX local_3a0;
  StrX local_390;
  long local_380;
  XMLCh *actRetCanRep_1;
  undefined1 local_370 [4];
  Status myStatus_13;
  StrX local_360;
  StrX local_350;
  long local_340;
  XMLCh *actRetCanRep;
  Status myStatus_12;
  int j;
  StrX local_320;
  StrX local_310;
  XSValue *local_300;
  XSValue *actRetValue_5;
  undefined1 local_2f0 [4];
  Status myStatus_11;
  StrX local_2e0;
  StrX local_2d0;
  XSValue *local_2c0;
  XSValue *actRetValue_4;
  undefined1 local_2b0 [4];
  Status myStatus_10;
  StrX local_2a0;
  StrX local_290;
  XSValue *local_280;
  XSValue *actRetValue_3;
  undefined1 local_270 [4];
  Status myStatus_9;
  StrX local_260;
  StrX local_250;
  XSValue *local_240;
  XSValue *actRetValue_2;
  undefined1 local_230 [4];
  Status myStatus_8;
  StrX local_220;
  StrX local_210;
  XSValue *local_200;
  XSValue *actRetValue_1;
  undefined1 local_1f0 [4];
  Status myStatus_7;
  StrX local_1e0;
  StrX local_1d0;
  XSValue *local_1c0;
  XSValue *actRetValue;
  Status myStatus_6;
  int i;
  StrX local_1a0;
  byte local_18d;
  Status local_18c;
  undefined1 local_188 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_178;
  byte local_165;
  Status local_164;
  undefined1 local_160 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_150;
  byte local_13d;
  Status local_13c;
  undefined1 local_138 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_128;
  byte local_115;
  Status local_114;
  undefined1 local_110 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_100;
  byte local_ed;
  Status local_ec;
  undefined1 local_e8 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_c8;
  byte local_b5;
  Status local_b4;
  bool actRetValid;
  Status myStatus;
  XSValue_Data act_v_ran_v_3;
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  char iv_3 [6];
  char iv_2 [6];
  char iv_1 [6];
  char v_3 [6];
  char v_2 [3];
  char v_1 [6];
  bool toValidate;
  DataType dt;
  
  stack0xffffffffffffffec = 0x412d6e65;
  v_3[2] = '\0';
  v_3[0] = 'j';
  v_3[1] = 'a';
  builtin_strncpy(iv_1,"uk-GB",6);
  builtin_strncpy(iv_2,"ja_JP",6);
  builtin_strncpy(iv_3,"en+US",6);
  act_v_ran_v_1.fValue._28_2_ = 0x6e;
  act_v_ran_v_1.fValue._24_4_ = 0x652d3231;
  act_v_ran_v_1.f_datatype = dt_string;
  act_v_ran_v_1._4_4_ = 0;
  act_v_ran_v_3.f_datatype = dt_string;
  act_v_ran_v_3._4_4_ = 0;
  local_b4 = st_Init;
  StrX::StrX(&local_c8,v_3 + 4);
  pXVar4 = StrX::unicodeForm(&local_c8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_language,&local_b4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_c8);
  local_b5 = bVar1 & 1;
  if (local_b5 != 1) {
    pXVar4 = getDataTypeString(dt_language);
    StrX::StrX((StrX *)local_e8,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_e8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x15b3,v_3 + 4,pcVar5,1);
    StrX::~StrX((StrX *)local_e8);
    errSeen = true;
  }
  local_ec = st_Init;
  StrX::StrX(&local_100,v_3);
  pXVar4 = StrX::unicodeForm(&local_100);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_language,&local_ec,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_100);
  local_ed = bVar1 & 1;
  if (local_ed != 1) {
    pXVar4 = getDataTypeString(dt_language);
    StrX::StrX((StrX *)local_110,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_110);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x15b4,v_3,pcVar5,1);
    StrX::~StrX((StrX *)local_110);
    errSeen = true;
  }
  local_114 = st_Init;
  StrX::StrX(&local_128,iv_1);
  pXVar4 = StrX::unicodeForm(&local_128);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_language,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_128);
  local_115 = bVar1 & 1;
  if (local_115 != 1) {
    pXVar4 = getDataTypeString(dt_language);
    StrX::StrX((StrX *)local_138,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_138);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x15b5,iv_1,pcVar5,1);
    StrX::~StrX((StrX *)local_138);
    errSeen = true;
  }
  local_13c = st_Init;
  StrX::StrX(&local_150,iv_2);
  pXVar4 = StrX::unicodeForm(&local_150);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_language,&local_13c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_150);
  local_13d = bVar1 & 1;
  if (local_13d != 0) {
    pXVar4 = getDataTypeString(dt_language);
    StrX::StrX((StrX *)local_160,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_160);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x15b8,iv_2,pcVar5,0);
    StrX::~StrX((StrX *)local_160);
    errSeen = true;
  }
  local_164 = st_Init;
  StrX::StrX(&local_178,iv_3);
  pXVar4 = StrX::unicodeForm(&local_178);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_language,&local_164,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_178);
  local_165 = bVar1 & 1;
  if (local_165 != 0) {
    pXVar4 = getDataTypeString(dt_language);
    StrX::StrX((StrX *)local_188,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_188);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x15b9,iv_3,pcVar5,0);
    StrX::~StrX((StrX *)local_188);
    errSeen = true;
  }
  local_18c = st_Init;
  StrX::StrX(&local_1a0,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar4 = StrX::unicodeForm(&local_1a0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_language,&local_18c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1a0);
  local_18d = bVar1 & 1;
  if (local_18d != 0) {
    pXVar4 = getDataTypeString(dt_language);
    StrX::StrX((StrX *)&myStatus_6,pXVar4);
    pcVar5 = StrX::localForm((StrX *)&myStatus_6);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x15ba,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,0);
    StrX::~StrX((StrX *)&myStatus_6);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = st_Init;
    StrX::StrX(&local_1d0,v_3 + 4);
    pXVar4 = StrX::unicodeForm(&local_1d0);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_language,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_1d0);
    local_1c0 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if ((Status)actRetValue != st_NoActVal) {
        pXVar4 = getDataTypeString(dt_language);
        StrX::StrX((StrX *)local_1f0,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_1f0);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString((Status)actRetValue);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x15d4,v_3 + 4,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_1f0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_language);
      StrX::StrX(&local_1e0,pXVar4);
      StrX::localForm(&local_1e0);
      pvVar10 = (void *)0x15d4;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15d4,v_3 + 4);
      StrX::~StrX(&local_1e0);
      pXVar6 = local_1c0;
      errSeen = true;
      if (local_1c0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_1c0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_1._4_4_ = st_Init;
    StrX::StrX(&local_210,v_3);
    pXVar4 = StrX::unicodeForm(&local_210);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_language,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_210);
    local_200 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_1._4_4_ != st_NoActVal) {
        pXVar4 = getDataTypeString(dt_language);
        StrX::StrX((StrX *)local_230,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_230);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString(actRetValue_1._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x15d5,v_3,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_230);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_language);
      StrX::StrX(&local_220,pXVar4);
      StrX::localForm(&local_220);
      pvVar10 = (void *)0x15d5;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15d5,v_3);
      StrX::~StrX(&local_220);
      pXVar6 = local_200;
      errSeen = true;
      if (local_200 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_200);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_2._4_4_ = st_Init;
    StrX::StrX(&local_250,iv_1);
    pXVar4 = StrX::unicodeForm(&local_250);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_language,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_250);
    local_240 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_2._4_4_ != st_NoActVal) {
        pXVar4 = getDataTypeString(dt_language);
        StrX::StrX((StrX *)local_270,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_270);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString(actRetValue_2._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x15d6,iv_1,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_270);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_language);
      StrX::StrX(&local_260,pXVar4);
      StrX::localForm(&local_260);
      pvVar10 = (void *)0x15d6;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15d6,iv_1);
      StrX::~StrX(&local_260);
      pXVar6 = local_240;
      errSeen = true;
      if (local_240 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_240);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_290,iv_2);
    pXVar4 = StrX::unicodeForm(&local_290);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_language,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_290);
    local_280 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_3._4_4_) {
          pXVar4 = getDataTypeString(dt_language);
          StrX::StrX((StrX *)local_2b0,pXVar4);
          pcVar5 = StrX::localForm((StrX *)local_2b0);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_3._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x15da,iv_2,pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)local_2b0);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_language);
      StrX::StrX(&local_2a0,pXVar4);
      StrX::localForm(&local_2a0);
      pvVar10 = (void *)0x15da;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15da,iv_2);
      StrX::~StrX(&local_2a0);
      pXVar6 = local_280;
      errSeen = true;
      if (local_280 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_280);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_2d0,iv_3);
    pXVar4 = StrX::unicodeForm(&local_2d0);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_language,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2d0);
    local_2c0 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_4._4_4_) {
          pXVar4 = getDataTypeString(dt_language);
          StrX::StrX((StrX *)local_2f0,pXVar4);
          pcVar5 = StrX::localForm((StrX *)local_2f0);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_4._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x15dc,iv_3,pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)local_2f0);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_language);
      StrX::StrX(&local_2e0,pXVar4);
      StrX::localForm(&local_2e0);
      pvVar10 = (void *)0x15dc;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15dc,iv_3);
      StrX::~StrX(&local_2e0);
      pXVar6 = local_2c0;
      errSeen = true;
      if (local_2c0 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2c0);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_310,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_310);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_language,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_310);
    local_300 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_5._4_4_) {
          pXVar4 = getDataTypeString(dt_language);
          StrX::StrX((StrX *)&myStatus_12,pXVar4);
          pcVar5 = StrX::localForm((StrX *)&myStatus_12);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_5._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x15de,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)&myStatus_12);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_language);
      StrX::StrX(&local_320,pXVar4);
      StrX::localForm(&local_320);
      pvVar10 = (void *)0x15de;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15de,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_320);
      pXVar6 = local_300;
      errSeen = true;
      if (local_300 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_300);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = st_Init;
    StrX::StrX(&local_350,v_3 + 4);
    pXVar4 = StrX::unicodeForm(&local_350);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_language,(Status *)&actRetCanRep,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_350);
    local_340 = lVar9;
    if (lVar9 == 0) {
      if ((Status)actRetCanRep != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_language);
        StrX::StrX((StrX *)local_370,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_370);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString((Status)actRetCanRep);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x15fb,v_3 + 4,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_370);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_language);
      StrX::StrX(&local_360,pXVar4);
      StrX::localForm(&local_360);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15fb,v_3 + 4);
      StrX::~StrX(&local_360);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_340);
      errSeen = true;
    }
    actRetCanRep_1._4_4_ = st_Init;
    StrX::StrX(&local_390,v_3);
    pXVar4 = StrX::unicodeForm(&local_390);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_language,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_390);
    local_380 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_1._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_language);
        StrX::StrX((StrX *)local_3b0,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_3b0);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_1._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x15fc,v_3,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_3b0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_language);
      StrX::StrX(&local_3a0,pXVar4);
      StrX::localForm(&local_3a0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15fc,v_3);
      StrX::~StrX(&local_3a0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_380);
      errSeen = true;
    }
    actRetCanRep_2._4_4_ = st_Init;
    StrX::StrX(&local_3d0,iv_1);
    pXVar4 = StrX::unicodeForm(&local_3d0);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_language,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3d0);
    local_3c0 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_2._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_language);
        StrX::StrX((StrX *)local_3f0,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_3f0);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_2._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x15fd,iv_1,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_3f0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_language);
      StrX::StrX(&local_3e0,pXVar4);
      StrX::localForm(&local_3e0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x15fd,iv_1);
      StrX::~StrX(&local_3e0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_3c0);
      errSeen = true;
    }
    actRetCanRep_3._4_4_ = st_Init;
    StrX::StrX(&local_410,iv_2);
    pXVar4 = StrX::unicodeForm(&local_410);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_language,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_410);
    local_400 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_3._4_4_) {
        pXVar4 = getDataTypeString(dt_language);
        StrX::StrX((StrX *)local_430,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_430);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_3._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1601,iv_2,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_430);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_language);
      StrX::StrX(&local_420,pXVar4);
      StrX::localForm(&local_420);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1601,iv_2);
      StrX::~StrX(&local_420);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_400);
      errSeen = true;
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_450,iv_3);
    pXVar4 = StrX::unicodeForm(&local_450);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_language,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_450);
    local_440 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_4._4_4_) {
        pXVar4 = getDataTypeString(dt_language);
        StrX::StrX((StrX *)local_470,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_470);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1603,iv_3,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_470);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_language);
      StrX::StrX(&local_460,pXVar4);
      StrX::localForm(&local_460);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1603,iv_3);
      StrX::~StrX(&local_460);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_440);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_490,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_490);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_language,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_490);
    local_480 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_5._4_4_) {
        pXVar4 = getDataTypeString(dt_language);
        StrX::StrX(&local_4b0,pXVar4);
        pcVar5 = StrX::localForm(&local_4b0);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1605,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX(&local_4b0);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_language);
      StrX::StrX(&local_4a0,pXVar4);
      StrX::localForm(&local_4a0);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1605,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_4a0);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_480);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_language()
{
    const XSValue::DataType dt = XSValue::dt_language;
    bool  toValidate = true;

    const char v_1[]="en-AT";
    const char v_2[]="ja";
    const char v_3[]="uk-GB";

    const char iv_1[]="ja_JP";
    const char iv_2[]="en+US";
    const char iv_3[]="12-en";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;
    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                      n/a            false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));

    }

}